

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data_parallel.h
# Opt level: O1

void highwayhash::ThreadPool::RunRange(ThreadPool *self,WorkerCommand command)

{
  atomic<int> *paVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  unique_lock<std::mutex> *this;
  int iVar5;
  int local_44;
  unique_lock<std::mutex> *local_40;
  WorkerCommand local_38;
  
  local_40 = (unique_lock<std::mutex> *)(command >> 0x20);
  local_38 = command;
  do {
    iVar4 = (int)local_40;
    iVar2 = (iVar4 - ((self->num_reserved_).super___atomic_base<int>._M_i + (int)local_38)) /
            (self->num_threads_ * 2);
    if (iVar2 < 2) {
      iVar2 = 1;
    }
    LOCK();
    paVar1 = &self->num_reserved_;
    iVar5 = (paVar1->super___atomic_base<int>)._M_i;
    (paVar1->super___atomic_base<int>)._M_i = (paVar1->super___atomic_base<int>)._M_i + iVar2;
    UNLOCK();
    iVar5 = iVar5 + (int)local_38;
    iVar3 = iVar2 + iVar5;
    if (iVar4 <= iVar2 + iVar5) {
      iVar3 = iVar4;
    }
    this = local_40;
    iVar2 = iVar5;
    if (iVar4 <= iVar5) {
      return;
    }
    do {
      local_44 = iVar2;
      if ((self->task_).super__Function_base._M_manager == (_Manager_type)0x0) {
        std::__throw_bad_function_call();
        if (this->_M_owns == true) {
          std::unique_lock<std::mutex>::unlock(this);
        }
        return;
      }
      this = (unique_lock<std::mutex> *)&self->task_;
      (*(self->task_)._M_invoker)((_Any_data *)&self->task_,&local_44);
      iVar2 = iVar2 + 1;
    } while (iVar2 < iVar3);
  } while (iVar5 < (int)local_40);
  return;
}

Assistant:

static void RunRange(ThreadPool* self, const WorkerCommand command) {
    const int begin = command & 0xFFFFFFFF;
    const int end = command >> 32;
    const int num_tasks = end - begin;

    // OpenMP introduced several "schedule" strategies:
    // "single" (static assignment of exactly one chunk per thread): slower.
    // "dynamic" (allocates k tasks at a time): competitive for well-chosen k.
    // "guided" (allocates k tasks, decreases k): computing k = remaining/n
    //   is faster than halving k each iteration. We prefer this strategy
    //   because it avoids user-specified parameters.

    for (;;) {
      const int num_reserved = self->num_reserved_.load();
      const int num_remaining = num_tasks - num_reserved;
      const int my_size = std::max(num_remaining / (self->num_threads_ * 2), 1);
      const int my_begin = begin + self->num_reserved_.fetch_add(my_size);
      const int my_end = std::min(my_begin + my_size, begin + num_tasks);
      // Another thread already reserved the last task.
      if (my_begin >= my_end) {
        break;
      }
      for (int i = my_begin; i < my_end; ++i) {
        self->task_(i);
      }
    }
  }